

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

void * Mf_ManGenerateCnf(Gia_Man_t *pGia,int nLutSize,int fCnfObjIds,int fAddOrCla,int fMapping,
                        int fVerbose)

{
  Jf_Par_t *pPars;
  Jf_Par_t Pars;
  Gia_Man_t *pNew;
  int fVerbose_local;
  int fMapping_local;
  int fAddOrCla_local;
  int fCnfObjIds_local;
  int nLutSize_local;
  Gia_Man_t *pGia_local;
  
  if ((2 < nLutSize) && (nLutSize < 9)) {
    Mf_ManSetDefaultPars((Jf_Par_t *)&pPars);
    Pars.fCutMin = 1;
    Pars.fUseMux7 = (int)((fCnfObjIds != 0 ^ 0xffU) & 1);
    pPars._0_4_ = nLutSize;
    Pars.fFuncDsd = fCnfObjIds;
    Pars.fGenCnf = fAddOrCla;
    Pars.fCnfObjIds = fMapping;
    Pars.fCutSimple = fVerbose;
    Pars.pTimesReq = (float *)Mf_ManPerformMapping(pGia,(Jf_Par_t *)&pPars);
    Gia_ManStopP((Gia_Man_t **)&Pars.pTimesReq);
    return pGia->pData;
  }
  __assert_fail("nLutSize >= 3 && nLutSize <= 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                ,0x6b1,"void *Mf_ManGenerateCnf(Gia_Man_t *, int, int, int, int, int)");
}

Assistant:

void * Mf_ManGenerateCnf( Gia_Man_t * pGia, int nLutSize, int fCnfObjIds, int fAddOrCla, int fMapping, int fVerbose )
{
    Gia_Man_t * pNew;
    Jf_Par_t Pars, * pPars = &Pars;
    assert( nLutSize >= 3 && nLutSize <= 8 );
    Mf_ManSetDefaultPars( pPars );
    pPars->fGenCnf     = 1;
    pPars->fCoarsen    = !fCnfObjIds;
    pPars->nLutSize    = nLutSize;
    pPars->fCnfObjIds  = fCnfObjIds;
    pPars->fAddOrCla   = fAddOrCla;
    pPars->fCnfMapping = fMapping;
    pPars->fVerbose    = fVerbose;
    pNew = Mf_ManPerformMapping( pGia, pPars );
    Gia_ManStopP( &pNew );
//    Cnf_DataPrint( (Cnf_Dat_t *)pGia->pData, 1 );
    return pGia->pData;
}